

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O3

bool Internal_WriteFacePtrList
               (unsigned_short face_count,size_t faceN_capacity,ON_SubDFacePtr *faceN,
               unsigned_short faceX_capacity,ON_SubDFacePtr *faceX,ON_BinaryArchive *archive)

{
  bool bVar1;
  ulong uVar2;
  uint archive_id;
  size_t sVar3;
  ON__UINT16 local_32;
  
  local_32 = face_count;
  ON_SubDArchiveIdMap::ValidateArrayCounts(&local_32,faceN_capacity,faceN,faceX_capacity,faceX);
  bVar1 = ON_BinaryArchive::WriteShort(archive,local_32);
  if (bVar1) {
    if (local_32 == 0) {
      return true;
    }
    sVar3 = 0;
    do {
      if (faceN_capacity == sVar3) {
        faceN = faceX;
      }
      archive_id = 0;
      uVar2 = faceN->m_ptr & 0xfffffffffffffff8;
      if (uVar2 != 0) {
        archive_id = *(uint *)(uVar2 + 0xc);
      }
      bVar1 = Internal_WriteArchiveIdAndFlags(archive_id,faceN->m_ptr,archive);
      if (!bVar1) break;
      sVar3 = sVar3 + 1;
      faceN = faceN + 1;
    } while (sVar3 < local_32);
    if (local_32 <= (ushort)sVar3) {
      return true;
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool Internal_WriteFacePtrList(
  unsigned short face_count,
  size_t faceN_capacity,
  const ON_SubDFacePtr* faceN,
  unsigned short faceX_capacity,
  const ON_SubDFacePtr* faceX,
  ON_BinaryArchive& archive
  )
{
  for (;;)
  {
    ON_SubDArchiveIdMap::ValidateArrayCounts(face_count,faceN_capacity,faceN,faceX_capacity,faceX);

    if (!archive.WriteShort(face_count))
      break;

    if ( 0 == face_count )
      return true;

    const ON_SubDFacePtr* fptr = faceN;
    unsigned short i = 0;
    for (i = 0; i < face_count; i++, fptr++)
    {
      if ( i == faceN_capacity)
        fptr = faceX;
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(fptr->m_ptr);
      if (!Internal_WriteArchiveIdAndFlags((nullptr != face) ? face->ArchiveId() : 0,fptr->m_ptr,archive))
        break;
    }
    if ( i < face_count )
      break;

    return true;
  }
  return ON_SUBD_RETURN_ERROR(false);
}